

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

void __thiscall network_pimpl::remove_event(network_pimpl *this,EventDataType *value)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  pointer this_00;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  string local_c0;
  string local_a0;
  network_pimpl *local_80;
  string local_78;
  vector<EventDataType,_std::allocator<EventDataType>_> *local_58;
  string local_50;
  
  this_00 = (this->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>._M_impl
            .super__Vector_impl_data._M_start;
  bVar4 = this_00 ==
          (this->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>._M_impl.
          super__Vector_impl_data._M_finish;
  local_80 = this;
  if (!bVar4) {
    local_58 = &this->events;
    lVar3 = -(long)this_00;
    do {
      EventDataType::getName_abi_cxx11_(&local_a0,this_00);
      EventDataType::getName_abi_cxx11_(&local_c0,value);
      if (local_a0._M_string_length == local_c0._M_string_length) {
        if (local_a0._M_string_length == 0) {
          bVar5 = true;
        }
        else {
          iVar1 = bcmp(local_a0._M_dataplus._M_p,local_c0._M_dataplus._M_p,local_a0._M_string_length
                      );
          bVar5 = iVar1 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      if (bVar5) {
        EventDataType::getOrigin_abi_cxx11_(&local_78,this_00);
        EventDataType::getOrigin_abi_cxx11_(&local_50,value);
        if (local_78._M_string_length != local_50._M_string_length) goto LAB_0021dc91;
        if (local_78._M_string_length == 0) {
          bVar6 = true;
        }
        else {
          iVar1 = bcmp(local_78._M_dataplus._M_p,local_50._M_dataplus._M_p,local_78._M_string_length
                      );
          bVar6 = iVar1 == 0;
        }
      }
      else {
LAB_0021dc91:
        bVar6 = false;
      }
      if (bVar5) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        std::vector<EventDataType,_std::allocator<EventDataType>_>::_M_erase
                  (local_58,(EventDataType *)-lVar3);
        if (!bVar4) {
          return;
        }
        break;
      }
      this_00 = this_00 + 1;
      lVar3 = lVar3 + -0x48;
      bVar4 = this_00 ==
              (local_80->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"---could not find event to delete. name: ",0x29);
  EventDataType::getName_abi_cxx11_(&local_a0,value);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," origin: ",9);
  EventDataType::getOrigin_abi_cxx11_(&local_c0,value);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_c0._M_dataplus._M_p,local_c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void network_pimpl::remove_event(const EventDataType &value){
    for(auto it = events.begin(); it != events.end(); ++it){
        if(it->getName() == value.getName() && it->getOrigin() == value.getOrigin()){
            events.erase(it);
            return;
        }
    }
    std::cerr << "---could not find event to delete. name: " << value.getName() << " origin: " << value.getOrigin() << "\n";
}